

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::null_scoped_padder>::format
          (source_location_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_2,memory_buf_t *dest)

{
  uint uVar1;
  char *__s;
  uint value;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  char *buf_ptr;
  format_decimal_result<char_*> fVar6;
  char local_40 [21];
  char acStack_2b [3];
  char *local_28;
  
  if ((msg->source).line != 0) {
    __s = (msg->source).filename;
    sVar2 = strlen(__s);
    ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar2);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = ':';
    uVar1 = (msg->source).line;
    value = -uVar1;
    if (0 < (int)uVar1) {
      value = uVar1;
    }
    fVar6 = ::fmt::v9::detail::format_decimal<char,unsigned_int>(local_40,value,0x15);
    local_28 = fVar6.begin;
    if ((int)uVar1 < 0) {
      local_28[-1] = '-';
      local_28 = local_28 + -1;
    }
    lVar5 = (long)local_40 - (long)local_28;
    if (lVar5 < -0x15) {
      ::fmt::v9::detail::assert_fail
                ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                 ,0x199,"negative value");
    }
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_28,local_28 + lVar5 + 0x15);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_hour, dest);
    }